

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O0

void __thiscall
t_generator::validate<t_function*>
          (t_generator *this,vector<t_function_*,_std::allocator<t_function_*>_> *list)

{
  bool bVar1;
  reference pptVar2;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_30;
  t_function **local_28;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_20;
  const_iterator it;
  vector<t_function_*,_std::allocator<t_function_*>_> *list_local;
  t_generator *this_local;
  
  it._M_current = (t_function **)list;
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (t_function **)
             std::vector<t_function_*,_std::allocator<t_function_*>_>::begin(it._M_current);
  local_20._M_current = local_28;
  while( true ) {
    local_30._M_current =
         (t_function **)std::vector<t_function_*,_std::allocator<t_function_*>_>::end(it._M_current)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_20);
    (*this->_vptr_t_generator[0xe])(this,*pptVar2);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void t_generator::validate(const vector<T>& list) const{
  typename vector<T>::const_iterator it;
  for(it=list.begin(); it != list.end(); ++it) {
      validate(*it);
  }
}